

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_write_compressed_img
              (fitsfile *fptr,int datatype,long *infpixel,long *inlpixel,int nullcheck,void *array,
              void *nullval,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *bnullarray;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long row;
  long lVar24;
  uint local_424;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long ntrows;
  long trowsize;
  int tstatus;
  int tilenul;
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  long lpixel [6];
  long fpixel [6];
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = fits_is_compressed_image(fptr,status);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
    *status = 0x19d;
    return 0x19d;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart != -1) || (iVar2 = ffrdef(fptr,status), iVar2 < 1))
    goto LAB_00178677;
LAB_00179014:
    iVar2 = *status;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
LAB_00178677:
    uVar16 = datatype & 0xfffffffe;
    uVar3 = 4;
    if (uVar16 == 0x14) {
      local_424 = 2;
      uVar11 = 2;
LAB_001786d4:
      pFVar1 = fptr->Fptr;
      uVar22 = (ulong)(uint)pFVar1->compress_type;
      if (uVar22 < 0x34) {
        if ((0x8000000600800U >> (uVar22 & 0x3f) & 1) == 0) {
          if (uVar22 != 0x1f) {
            if (uVar22 != 0x29) goto LAB_00179045;
            if (pFVar1->zbitpix != 8) {
              uVar16 = uVar3;
              if (pFVar1->zbitpix != 0x10) {
                uVar16 = 8;
              }
              goto LAB_0017873a;
            }
          }
LAB_00178738:
          uVar16 = uVar3;
        }
        else {
          uVar16 = local_424;
          if ((pFVar1->zbitpix != 8) && (uVar16 = uVar11, pFVar1->zbitpix != 0x10))
          goto LAB_00178738;
        }
LAB_0017873a:
        pcVar4 = (char *)calloc(pFVar1->maxtilelen,(ulong)uVar16);
        if (pcVar4 == (char *)0x0) {
          ffpmsg("Out of memory (fits_write_compress_img)");
          *status = 0x71;
          return 0x71;
        }
        lVar19 = 1;
        for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
          naxis[lVar5] = 1;
          tilesize[lVar5] = 1;
          ftile[lVar5] = 1;
          ltile[lVar5] = 1;
          rowdim[lVar5] = 1;
        }
        uVar3 = pFVar1->zndim;
        lVar5 = 0;
        uVar22 = 0;
        if (0 < (int)uVar3) {
          uVar22 = (ulong)uVar3;
        }
        for (; uVar22 * 8 != lVar5; lVar5 = lVar5 + 8) {
          lVar6 = *(long *)((long)infpixel + lVar5);
          *(long *)((long)fpixel + lVar5) = lVar6;
          lVar12 = *(long *)((long)inlpixel + lVar5);
          *(long *)((long)lpixel + lVar5) = lVar12;
          lVar7 = *(long *)((long)pFVar1->znaxis + lVar5);
          *(long *)((long)naxis + lVar5) = lVar7;
          if (lVar6 < 1) {
            free(pcVar4);
            *status = 0x141;
            return 0x141;
          }
          lVar15 = *(long *)((long)pFVar1->tilesize + lVar5);
          *(long *)((long)tilesize + lVar5) = lVar15;
          *(long *)((long)ftile + lVar5) = (lVar6 + -1) / lVar15 + 1;
          lVar6 = (lVar12 + -1) / lVar15 + 1;
          lVar12 = (long)((int)((lVar7 + -1) / lVar15) + 1);
          if (lVar12 <= lVar6) {
            lVar6 = lVar12;
          }
          *(long *)((long)ltile + lVar5) = lVar6;
          *(long *)((long)rowdim + lVar5) = lVar19;
          lVar19 = lVar19 * lVar12;
        }
        local_418 = (ftile[1] + -1) * rowdim[1] + (ftile[2] + -1) * rowdim[2] +
                    (ftile[3] + -1) * rowdim[3] + (ftile[4] + -1) * rowdim[4] +
                    (ftile[5] + -1) * rowdim[5] + ftile[0];
        lVar5 = (ftile[0] + -1) * tilesize[0];
        for (lVar19 = ftile[5]; lVar19 <= ltile[5]; lVar19 = lVar19 + 1) {
          lVar6 = (lVar19 + -1) * tilesize[5];
          tfpixel[5] = lVar6 + 1;
          tlpixel[5] = tilesize[5] * lVar19;
          if (naxis[5] <= tilesize[5] * lVar19) {
            tlpixel[5] = naxis[5];
          }
          lVar6 = tlpixel[5] - lVar6;
          local_410 = local_418;
          for (lVar12 = ftile[4]; lVar12 <= ltile[4]; lVar12 = lVar12 + 1) {
            lVar7 = (lVar12 + -1) * tilesize[4];
            tfpixel[4] = lVar7 + 1;
            tlpixel[4] = tilesize[4] * lVar12;
            if (naxis[4] <= tilesize[4] * lVar12) {
              tlpixel[4] = naxis[4];
            }
            lVar7 = tlpixel[4] - lVar7;
            local_408 = local_410;
            for (lVar15 = ftile[3]; lVar15 <= ltile[3]; lVar15 = lVar15 + 1) {
              lVar8 = (lVar15 + -1) * tilesize[3];
              tfpixel[3] = lVar8 + 1;
              tlpixel[3] = tilesize[3] * lVar15;
              if (naxis[3] <= tilesize[3] * lVar15) {
                tlpixel[3] = naxis[3];
              }
              lVar8 = tlpixel[3] - lVar8;
              local_400 = local_408;
              for (lVar14 = ftile[2]; lVar14 <= ltile[2]; lVar14 = lVar14 + 1) {
                lVar9 = (lVar14 + -1) * tilesize[2];
                tfpixel[2] = lVar9 + 1;
                tlpixel[2] = tilesize[2] * lVar14;
                if (naxis[2] <= tilesize[2] * lVar14) {
                  tlpixel[2] = naxis[2];
                }
                lVar9 = tlpixel[2] - lVar9;
                lVar24 = local_400;
                for (lVar21 = ftile[1]; lVar21 <= ltile[1]; lVar21 = lVar21 + 1) {
                  lVar10 = (lVar21 + -1) * tilesize[1];
                  tfpixel[1] = lVar10 + 1;
                  tlpixel[1] = tilesize[1] * lVar21;
                  if (naxis[1] <= tilesize[1] * lVar21) {
                    tlpixel[1] = naxis[1];
                  }
                  lVar10 = tlpixel[1] - lVar10;
                  lVar13 = lVar5 + 1;
                  lVar17 = -lVar5;
                  lVar18 = ftile[0] * tilesize[0];
                  lVar20 = ftile[0];
                  row = lVar24;
                  while( true ) {
                    lVar23 = lVar18;
                    if (naxis[0] < lVar18) {
                      lVar23 = naxis[0];
                    }
                    if (ltile[0] < lVar20) break;
                    tlpixel[0] = naxis[0];
                    if (lVar18 < naxis[0]) {
                      tlpixel[0] = lVar18;
                    }
                    lVar23 = (lVar23 + lVar17) * lVar10 * lVar9 * lVar8 * lVar7 * lVar6;
                    iVar2 = 0;
                    bnullarray = (char *)nullval;
                    tfpixel[0] = lVar13;
                    imcomp_decompress_tile
                              (fptr,(int)row,(int)lVar23,datatype,nullcheck,nullval,pcVar4,
                               (char *)0x0,&tilenul,status);
                    if (*status == 0x19f) {
                      memset(pcVar4,0,lVar23 * (ulong)local_424);
                      *status = 0;
                    }
                    imcomp_merge_overlap
                              (pcVar4,local_424,uVar3,tfpixel,tlpixel,bnullarray,(char *)array,
                               fpixel,lpixel,iVar2,status);
                    fits_calc_tile_rows(tlpixel,tfpixel,uVar3,&trowsize,&ntrows,status);
                    imcomp_compress_tile
                              (fptr,row,datatype,pcVar4,lVar23,trowsize,ntrows,nullcheck,nullval,
                               status);
                    lVar20 = lVar20 + 1;
                    lVar18 = lVar18 + tilesize[0];
                    lVar17 = lVar17 - tilesize[0];
                    lVar13 = lVar13 + tilesize[0];
                    row = row + 1;
                  }
                  lVar24 = lVar24 + rowdim[1];
                }
                local_400 = local_400 + rowdim[2];
              }
              local_408 = local_408 + rowdim[3];
            }
            local_410 = local_410 + rowdim[4];
          }
          local_418 = local_418 + rowdim[5];
        }
        free(pcVar4);
        if ((nullcheck != 0) && (fptr->Fptr->zbitpix < 0)) {
          tstatus = 0;
          ffgcrd(fptr,"ZBLANK",card,&tstatus);
          if (tstatus != 0) {
            ffgcrd(fptr,"ZCMPTYPE",card,status);
            ffikyj(fptr,"ZBLANK",-0x7fffffff,"null value in the compressed integer array",status);
            pFVar1 = fptr->Fptr;
            pFVar1->zblank = -0x7fffffff;
            pFVar1->cn_zblank = -1;
          }
        }
        goto LAB_00179014;
      }
LAB_00179045:
      pcVar4 = "unsupported image compression algorithm";
    }
    else {
      uVar11 = uVar3;
      local_424 = uVar3;
      if (uVar16 == 0x1e) goto LAB_001786d4;
      if (datatype - 0xbU < 2) {
        uVar11 = 2;
        local_424 = 1;
        goto LAB_001786d4;
      }
      uVar11 = 8;
      uVar3 = uVar11;
      local_424 = uVar11;
      if (uVar16 == 0x28) goto LAB_001786d4;
      if (datatype == 0x2a) {
        uVar11 = 4;
        uVar3 = uVar11;
        local_424 = uVar11;
        goto LAB_001786d4;
      }
      if (datatype == 0x52) goto LAB_001786d4;
      pcVar4 = "unsupported datatype for compressing image";
    }
    ffpmsg(pcVar4);
    *status = 0x19a;
    iVar2 = 0x19a;
  }
  return iVar2;
}

Assistant:

int fits_write_compressed_img(fitsfile *fptr,   /* I - FITS file pointer     */
            int  datatype,   /* I - datatype of the array to be written      */
            long  *infpixel, /* I - 'bottom left corner' of the subsection   */
            long  *inlpixel, /* I - 'top right corner' of the subsection     */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,     /* I - array of values to be written            */
            void *nullval,   /* I - undefined pixel value                    */
            int  *status)    /* IO - error status                            */
/*
   Write a section of a compressed image.
*/
{
    int  tiledim[MAX_COMPRESS_DIM];
    long naxis[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow, trowsize, ntrows;
    int ii, ndim, pixlen, tilenul;
    int  tstatus, buffpixsiz;
    void *buffer;
    char *bnullarray = 0, card[FLEN_CARD];

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);


    /* ===================================================================== */


    if (datatype == TSHORT || datatype == TUSHORT)
    {
       pixlen = sizeof(short);
    }
    else if (datatype == TINT || datatype == TUINT)
    {
       pixlen = sizeof(int);
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       pixlen = 1;
    }
    else if (datatype == TLONG || datatype == TULONG)
    {
       pixlen = sizeof(long);
    }
    else if (datatype == TFLOAT)
    {
       pixlen = sizeof(float);
    }
    else if (datatype == TDOUBLE)
    {
       pixlen = sizeof(double);
    }
    else
    {
        ffpmsg("unsupported datatype for compressing image");
        return(*status = BAD_DATATYPE);
    }

    /* ===================================================================== */

    /* allocate scratch space for processing one tile of the image */
    buffpixsiz = pixlen;  /* this is the minimum pixel size */
    
    if ( (fptr->Fptr)->compress_type == HCOMPRESS_1) { /* need 4 or 8 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG ||
	    (fptr->Fptr)->zbitpix == SHORT_IMG )
                buffpixsiz = maxvalue(buffpixsiz, 4);
        else
	        buffpixsiz = 8;
    }
    else if ( (fptr->Fptr)->compress_type == PLIO_1) { /* need 4 bytes per pixel */
                buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else if ( (fptr->Fptr)->compress_type == RICE_1  ||
              (fptr->Fptr)->compress_type == GZIP_1 ||
              (fptr->Fptr)->compress_type == GZIP_2 ||
              (fptr->Fptr)->compress_type == BZIP2_1) {  /* need 1, 2, or 4 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 1);
        else if ((fptr->Fptr)->zbitpix == SHORT_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 2);
        else 
            buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else
    {
        ffpmsg("unsupported image compression algorithm");
        return(*status = BAD_DATATYPE);
    }
    
    /* cast to double to force alignment on 8-byte addresses */
    buffer = (double *) calloc ((fptr->Fptr)->maxtilelen, buffpixsiz);

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_write_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }

    /* ===================================================================== */

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        fpixel[ii] = infpixel[ii];
        lpixel[ii] = inlpixel[ii];

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
              tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
              tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

              /* read and uncompress this row (tile) of the table */
              /* also do type conversion and undefined pixel substitution */
              /* at this point */
              imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

              if (*status == NO_COMPRESSED_TILE)
              {
                   /* tile doesn't exist, so initialize to zero */
                   memset(buffer, 0, pixlen * thistilesize[0]);
                   *status = 0;
              }

              /* copy the intersecting pixels to this tile from the input */
              imcomp_merge_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, nullcheck, status);
                     
             /* Collapse sizes of higher dimension tiles into 2 dimensional
                equivalents needed by the quantizing algorithms for
                floating point types */
              fits_calc_tile_rows(tlpixel, tfpixel, ndim, &trowsize,
                              &ntrows, status);

              /* compress the tile again, and write it back to the FITS file */
              imcomp_compress_tile (fptr, irow, datatype, buffer, 
                                    thistilesize[0],
				    trowsize,
				    ntrows,
				    nullcheck, nullval, 
				    status);
            }
          }
        }
      }
     }
    }
    free(buffer);
    

    if ((fptr->Fptr)->zbitpix < 0 && nullcheck != 0) { 
/*
     This is a floating point FITS image with possible null values.
     It is too messy to test if any null values are actually written, so 
     just assume so.  We need to make sure that the
     ZBLANK keyword is present in the compressed image header.  If it is not
     there then we need to insert the keyword. 
*/   
        tstatus = 0;
        ffgcrd(fptr, "ZBLANK", card, &tstatus);

	if (tstatus) {   /* have to insert the ZBLANK keyword */
           ffgcrd(fptr, "ZCMPTYPE", card, status);
           ffikyj(fptr, "ZBLANK", COMPRESS_NULL_VALUE, 
                "null value in the compressed integer array", status);
	
           /* set this value into the internal structure; it is used if */
	   /* the program reads back the values from the array */
	 
          (fptr->Fptr)->zblank = COMPRESS_NULL_VALUE;
          (fptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }  
    }  
    
    return(*status);
}